

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

Tag embree::SceneGraph::typeTagOfString(string *ty)

{
  bool bVar1;
  runtime_error *this;
  Tag TVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = std::operator==(ty,"char");
  TVar2 = PTY_CHAR;
  if (!bVar1) {
    bVar1 = std::operator==(ty,"int8");
    if (!bVar1) {
      bVar1 = std::operator==(ty,"uchar");
      TVar2 = PTY_UCHAR;
      if (!bVar1) {
        bVar1 = std::operator==(ty,"uint8");
        if (!bVar1) {
          bVar1 = std::operator==(ty,"short");
          TVar2 = PTY_SHORT;
          if (!bVar1) {
            bVar1 = std::operator==(ty,"int16");
            if (!bVar1) {
              bVar1 = std::operator==(ty,"ushort");
              TVar2 = PTY_USHORT;
              if (!bVar1) {
                bVar1 = std::operator==(ty,"uint16");
                if (!bVar1) {
                  bVar1 = std::operator==(ty,"int");
                  TVar2 = PTY_INT;
                  if (!bVar1) {
                    bVar1 = std::operator==(ty,"int32");
                    if (!bVar1) {
                      bVar1 = std::operator==(ty,"uint");
                      TVar2 = PTY_UINT;
                      if (!bVar1) {
                        bVar1 = std::operator==(ty,"uint32");
                        if (!bVar1) {
                          bVar1 = std::operator==(ty,"float");
                          TVar2 = PTY_FLOAT;
                          if (!bVar1) {
                            bVar1 = std::operator==(ty,"float32");
                            if (!bVar1) {
                              bVar1 = std::operator==(ty,"double");
                              if (!bVar1) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::operator+(&bStack_38,"invalid type ",ty);
                                std::runtime_error::runtime_error(this,(string *)&bStack_38);
                                __cxa_throw(this,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              TVar2 = PTY_DOUBLE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

Type::Tag typeTagOfString(const std::string& ty) {
      if (ty == "char") return Type::PTY_CHAR;
      if (ty == "int8") return Type::PTY_CHAR;
      if (ty == "uchar") return Type::PTY_UCHAR;
      if (ty == "uint8") return Type::PTY_UCHAR;
      if (ty == "short") return Type::PTY_SHORT;
      if (ty == "int16") return Type::PTY_SHORT;
      if (ty == "ushort") return Type::PTY_USHORT;
      if (ty == "uint16") return Type::PTY_USHORT;
      if (ty == "int") return Type::PTY_INT;
      if (ty == "int32") return Type::PTY_INT;
      if (ty == "uint") return Type::PTY_UINT;
      if (ty == "uint32") return Type::PTY_UINT;
      if (ty == "float") return Type::PTY_FLOAT;
      if (ty == "float32") return Type::PTY_FLOAT;
      if (ty == "double") return Type::PTY_DOUBLE;
      throw std::runtime_error("invalid type " + ty);
      return Type::PTY_NONE;
    }